

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::update(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *this,int p_col,
        number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        *p_work,int *p_idx,int num)

{
  uint *puVar1;
  uint uVar2;
  fpclass_type fVar3;
  undefined8 uVar4;
  int32_t iVar5;
  int iVar6;
  int *piVar7;
  cpp_dec_float<50U,_int,_void> *pcVar8;
  int iVar9;
  byte bVar10;
  fpclass_type *pfVar11;
  long lVar12;
  int32_t *piVar13;
  int p_row;
  cpp_dec_float<50U,_int,_void> *pcVar14;
  long lVar15;
  cpp_dec_float<50U,_int,_void> uu;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_158;
  int *local_120;
  ulong local_118;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_110;
  pointer local_108;
  cpp_dec_float<50U,_int,_void> *local_100;
  cpp_dec_float<50U,_int,_void> local_f8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  uint local_98;
  int *local_88;
  int *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  uint *local_70;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_98 = 0;
  local_120 = (int *)CONCAT44(local_120._4_4_,p_col);
  local_118 = (ulong)p_col;
  pcVar8 = &p_work[local_118].m_backend;
  local_68.fpclass = cpp_dec_float_finite;
  local_68.prec_elem = 10;
  local_68.data._M_elems[0] = 0;
  local_68.data._M_elems[1] = 0;
  local_68.data._M_elems[2] = 0;
  local_68.data._M_elems[3] = 0;
  local_68.data._M_elems[4] = 0;
  local_68.data._M_elems[5] = 0;
  local_68.data._M_elems._24_5_ = 0;
  local_68.data._M_elems[7]._1_3_ = 0;
  local_68.data._M_elems._32_5_ = 0;
  local_68.data._M_elems[9]._1_3_ = 0;
  local_68.exp = 0;
  local_68.neg = false;
  local_78 = p_work;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_158,1,(type *)0x0);
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_68,&local_158,pcVar8);
  local_f8.data._M_elems[7]._1_3_ = local_68.data._M_elems[7]._1_3_;
  local_f8.data._M_elems._24_5_ = local_68.data._M_elems._24_5_;
  local_f8.data._M_elems[0] = local_68.data._M_elems[0];
  local_f8.data._M_elems[1] = local_68.data._M_elems[1];
  local_f8.data._M_elems[2] = local_68.data._M_elems[2];
  local_f8.data._M_elems[3] = local_68.data._M_elems[3];
  local_f8.data._M_elems[4] = local_68.data._M_elems[4];
  local_f8.data._M_elems[5] = local_68.data._M_elems[5];
  local_f8.data._M_elems[9]._1_3_ = local_68.data._M_elems[9]._1_3_;
  local_f8.data._M_elems._32_5_ = local_68.data._M_elems._32_5_;
  local_f8.exp = local_68.exp;
  local_f8.neg = local_68.neg;
  local_f8.fpclass = local_68.fpclass;
  local_f8.prec_elem = local_68.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)pcVar8,0.0);
  p_row = (int)local_118;
  iVar6 = makeLvec(this,num,p_row);
  local_108 = (this->l).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_88 = (this->l).idx;
  iVar9 = p_idx[(long)num + -1];
  local_110 = this;
  local_80 = p_idx;
  if (iVar9 != p_row) {
    local_100 = (cpp_dec_float<50U,_int,_void> *)CONCAT44(local_100._4_4_,iVar6);
    piVar7 = local_88 + iVar6;
    pfVar11 = &local_108[iVar6].m_backend.fpclass;
    lVar15 = 0;
    local_118 = (ulong)(uint)num;
    do {
      *piVar7 = iVar9;
      pcVar14 = &local_78[iVar9].m_backend;
      local_158.fpclass = cpp_dec_float_finite;
      local_158.prec_elem = 10;
      local_158.data._M_elems[0] = 0;
      local_158.data._M_elems[1] = 0;
      local_158.data._M_elems[2] = 0;
      local_158.data._M_elems[3] = 0;
      local_158.data._M_elems[4] = 0;
      local_158.data._M_elems[5] = 0;
      local_158.data._M_elems[6] = 0;
      local_158.data._M_elems[7] = 0;
      local_158.data._M_elems[8] = 0;
      local_158.data._M_elems[9] = 0;
      local_158.exp = 0;
      local_158.neg = false;
      pcVar8 = &local_f8;
      if (&local_158 != pcVar14) {
        local_158.data._M_elems[8] = local_f8.data._M_elems[8];
        local_158.data._M_elems[9] = local_f8.data._M_elems[9];
        local_158.data._M_elems[4] = local_f8.data._M_elems[4];
        local_158.data._M_elems[5] = local_f8.data._M_elems[5];
        local_158.data._M_elems[6] = local_f8.data._M_elems[6];
        local_158.data._M_elems[7] = local_f8.data._M_elems[7];
        local_158.data._M_elems[0] = local_f8.data._M_elems[0];
        local_158.data._M_elems[1] = local_f8.data._M_elems[1];
        local_158.data._M_elems[2] = local_f8.data._M_elems[2];
        local_158.data._M_elems[3] = local_f8.data._M_elems[3];
        local_158.exp = local_f8.exp;
        local_158.neg = local_f8.neg;
        local_158.fpclass = local_f8.fpclass;
        local_158.prec_elem = local_f8.prec_elem;
        pcVar8 = pcVar14;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_158,pcVar8);
      *(ulong *)(((cpp_dec_float<50U,_int,_void> *)(pfVar11 + -0xc))->data)._M_elems =
           CONCAT44(local_158.data._M_elems[1],local_158.data._M_elems[0]);
      *(ulong *)(pfVar11 + -10) = CONCAT44(local_158.data._M_elems[3],local_158.data._M_elems[2]);
      *(ulong *)(pfVar11 + -8) = CONCAT44(local_158.data._M_elems[5],local_158.data._M_elems[4]);
      *(ulong *)(pfVar11 + -6) = CONCAT44(local_158.data._M_elems[7],local_158.data._M_elems[6]);
      *(ulong *)(pfVar11 + -4) = CONCAT44(local_158.data._M_elems[9],local_158.data._M_elems[8]);
      pfVar11[-2] = local_158.exp;
      *(bool *)(pfVar11 + -1) = local_158.neg;
      *(undefined8 *)pfVar11 = local_158._48_8_;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)pcVar14,0.0);
      iVar9 = p_idx[(long)num + lVar15 + -2];
      piVar7 = piVar7 + 1;
      pfVar11 = pfVar11 + 0xe;
      lVar15 = lVar15 + -1;
    } while (iVar9 != (int)local_120);
    iVar6 = (int)local_100 - (int)lVar15;
    num = (int)local_118 + (int)lVar15;
  }
  piVar7 = local_80;
  lVar15 = (long)iVar6;
  local_88[lVar15] = (int)local_120;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_158,1,(type *)0x0);
  local_68.data._M_elems._32_5_ = local_f8.data._M_elems._32_5_;
  local_68.data._M_elems[9]._1_3_ = local_f8.data._M_elems[9]._1_3_;
  local_68.data._M_elems[4] = local_f8.data._M_elems[4];
  local_68.data._M_elems[5] = local_f8.data._M_elems[5];
  local_68.data._M_elems._24_5_ = local_f8.data._M_elems._24_5_;
  local_68.data._M_elems[7]._1_3_ = local_f8.data._M_elems[7]._1_3_;
  local_68.data._M_elems[0] = local_f8.data._M_elems[0];
  local_68.data._M_elems[1] = local_f8.data._M_elems[1];
  local_68.data._M_elems[2] = local_f8.data._M_elems[2];
  local_68.data._M_elems[3] = local_f8.data._M_elems[3];
  local_68.exp = local_f8.exp;
  local_68.neg = local_f8.neg;
  local_68.fpclass = local_f8.fpclass;
  local_68.prec_elem = local_f8.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=(&local_68,&local_158);
  if (local_68.data._M_elems[0] != 0 || local_68.fpclass != cpp_dec_float_finite) {
    local_68.neg = (bool)(local_68.neg ^ 1);
  }
  *(ulong *)((long)local_108[lVar15].m_backend.data._M_elems + 0x20) =
       CONCAT35(local_68.data._M_elems[9]._1_3_,local_68.data._M_elems._32_5_);
  puVar1 = (uint *)((long)local_108[lVar15].m_backend.data._M_elems + 0x10);
  *(undefined8 *)puVar1 = local_68.data._M_elems._16_8_;
  *(ulong *)(puVar1 + 2) = CONCAT35(local_68.data._M_elems[7]._1_3_,local_68.data._M_elems._24_5_);
  *(undefined8 *)local_108[lVar15].m_backend.data._M_elems = local_68.data._M_elems._0_8_;
  *(undefined8 *)((long)local_108[lVar15].m_backend.data._M_elems + 8) =
       local_68.data._M_elems._8_8_;
  local_108[lVar15].m_backend.exp = local_68.exp;
  local_108[lVar15].m_backend.neg = local_68.neg;
  local_108[lVar15].m_backend.fpclass = local_68.fpclass;
  local_108[lVar15].m_backend.prec_elem = local_68.prec_elem;
  if (1 < num) {
    local_100 = &(local_110->maxabs).m_backend;
    local_70 = (local_110->maxabs).m_backend.data._M_elems + 1;
    lVar12 = (ulong)(num - 2) + 1;
    local_120 = local_88 + lVar15;
    piVar13 = &local_108[lVar15 + 1].m_backend.prec_elem;
    do {
      local_120 = local_120 + 1;
      iVar9 = piVar7[lVar12 + -1];
      *local_120 = iVar9;
      pcVar14 = &local_78[iVar9].m_backend;
      local_158.fpclass = cpp_dec_float_finite;
      local_158.prec_elem = 10;
      local_158.data._M_elems[0] = 0;
      local_158.data._M_elems[1] = 0;
      local_158.data._M_elems[2] = 0;
      local_158.data._M_elems[3] = 0;
      local_158.data._M_elems[4] = 0;
      local_158.data._M_elems[5] = 0;
      local_158.data._M_elems[6] = 0;
      local_158.data._M_elems[7] = 0;
      local_158.data._M_elems[8] = 0;
      local_158.data._M_elems[9] = 0;
      local_158.exp = 0;
      local_158.neg = false;
      pcVar8 = &local_f8;
      if (&local_158 != pcVar14) {
        local_158.data._M_elems[8] = local_f8.data._M_elems[8];
        local_158.data._M_elems[9] = local_f8.data._M_elems[9];
        local_158.data._M_elems[4] = local_f8.data._M_elems[4];
        local_158.data._M_elems[5] = local_f8.data._M_elems[5];
        local_158.data._M_elems[6] = local_f8.data._M_elems[6];
        local_158.data._M_elems[7] = local_f8.data._M_elems[7];
        local_158.data._M_elems[0] = local_f8.data._M_elems[0];
        local_158.data._M_elems[1] = local_f8.data._M_elems[1];
        local_158.data._M_elems[2] = local_f8.data._M_elems[2];
        local_158.data._M_elems[3] = local_f8.data._M_elems[3];
        local_158.exp = local_f8.exp;
        local_158.neg = local_f8.neg;
        local_158.fpclass = local_f8.fpclass;
        local_158.prec_elem = local_f8.prec_elem;
        pcVar8 = pcVar14;
      }
      local_118 = lVar12;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_158,pcVar8);
      uVar4 = local_158._48_8_;
      bVar10 = local_158.neg;
      uVar2 = local_158.data._M_elems[0];
      local_108 = (pointer)CONCAT44(local_108._4_4_,local_158.exp);
      local_b8 = CONCAT44(local_158.data._M_elems[2],local_158.data._M_elems[1]);
      uStack_b0 = CONCAT44(local_158.data._M_elems[4],local_158.data._M_elems[3]);
      local_a8 = CONCAT44(local_158.data._M_elems[6],local_158.data._M_elems[5]);
      uStack_a0 = CONCAT44(local_158.data._M_elems[8],local_158.data._M_elems[7]);
      local_98 = local_158.data._M_elems[9];
      fVar3 = local_158.fpclass;
      iVar5 = local_158.prec_elem;
      (((cpp_dec_float<50U,_int,_void> *)(piVar13 + -0xd))->data)._M_elems[0] =
           local_158.data._M_elems[0];
      piVar13[-4] = local_158.data._M_elems[9];
      *(undefined8 *)(piVar13 + -8) = local_a8;
      *(undefined8 *)(piVar13 + -6) = uStack_a0;
      *(undefined8 *)(piVar13 + -0xc) = local_b8;
      *(undefined8 *)(piVar13 + -10) = uStack_b0;
      piVar13[-3] = local_158.exp;
      *(bool *)(piVar13 + -2) = local_158.neg;
      piVar13[-1] = local_158.fpclass;
      *piVar13 = local_158.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)pcVar14,0.0);
      local_158.data._M_elems[9] = local_98;
      local_158.data._M_elems[5] = (uint)local_a8;
      local_158.data._M_elems[6] = (uint)((ulong)local_a8 >> 0x20);
      local_158.data._M_elems[7] = (uint)uStack_a0;
      local_158.data._M_elems[8] = (uint)((ulong)uStack_a0 >> 0x20);
      local_158.data._M_elems[1] = (uint)local_b8;
      local_158.data._M_elems[2] = (uint)((ulong)local_b8 >> 0x20);
      local_158.data._M_elems[3] = (uint)uStack_b0;
      local_158.data._M_elems[4] = (uint)((ulong)uStack_b0 >> 0x20);
      iVar9 = (int)local_108;
      local_158.exp = (int)local_108;
      local_158.neg = (bool)bVar10;
      if (((bool)bVar10 == true) && (fVar3 != cpp_dec_float_finite || uVar2 != 0)) {
        local_158.neg = false;
      }
      if (((fVar3 != cpp_dec_float_NaN) &&
          ((local_110->maxabs).m_backend.fpclass != cpp_dec_float_NaN)) &&
         (local_158.data._M_elems[0] = uVar2, local_158._48_8_ = uVar4,
         iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_158,local_100), 0 < iVar6)) {
        if ((bool)bVar10 != false) {
          bVar10 = bVar10 ^ (fVar3 != cpp_dec_float_finite || uVar2 != 0);
        }
        (local_110->maxabs).m_backend.data._M_elems[0] = uVar2;
        local_70[8] = local_98;
        *(undefined8 *)(local_70 + 4) = local_a8;
        *(undefined8 *)(local_70 + 6) = uStack_a0;
        *(undefined8 *)local_70 = local_b8;
        *(undefined8 *)(local_70 + 2) = uStack_b0;
        (local_110->maxabs).m_backend.exp = iVar9;
        (local_110->maxabs).m_backend.neg = (bool)bVar10;
        (local_110->maxabs).m_backend.fpclass = fVar3;
        (local_110->maxabs).m_backend.prec_elem = iVar5;
      }
      piVar13 = piVar13 + 0xe;
      lVar12 = local_118 + -1;
      piVar7 = local_80;
    } while (lVar12 != 0 && 0 < (long)local_118);
  }
  local_110->stat = OK;
  return;
}

Assistant:

void CLUFactor<R>::update(int p_col, R* p_work, const int* p_idx, int num)
{
   int ll, i, j;
   int* lidx;
   R* lval;
   R x, rezi;

   assert(p_work[p_col] != 0.0);
   rezi = 1 / p_work[p_col];
   p_work[p_col] = 0.0;

   ll = makeLvec(num, p_col);
   //   ll = fac->makeLvec(num, col);
   lval = l.val.data();
   lidx = l.idx;

   for(i = num - 1; (j = p_idx[i]) != p_col; --i)
   {
      lidx[ll] = j;
      lval[ll] = rezi * p_work[j];
      p_work[j] = 0.0;
      ++ll;
   }

   lidx[ll] = p_col;

   lval[ll] = 1 - rezi;
   ++ll;

   for(--i; i >= 0; --i)
   {
      j = p_idx[i];
      lidx[ll] = j;
      lval[ll] = x = rezi * p_work[j];
      p_work[j] = 0.0;
      ++ll;

      if(spxAbs(x) > maxabs)
         maxabs = spxAbs(x);
   }

   this->stat = SLinSolver<R>::OK;
}